

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protostream_objectwriter.cc
# Opt level: O3

Status * google::protobuf::util::converter::ProtoStreamObjectWriter::RenderFieldMask
                   (Status *__return_storage_ptr__,ProtoStreamObjectWriter *ow,DataPiece *data)

{
  AlphaNum *b;
  PathSinkCallback *in_R8;
  StringPiece SVar1;
  StringPiece paths;
  char *local_f0;
  undefined8 local_e8;
  AlphaNum local_c0;
  string local_90;
  string local_70;
  undefined8 *local_50;
  undefined8 local_48;
  code *local_40;
  code *local_38;
  
  if (data->type_ == TYPE_STRING) {
    SVar1 = DataPiece::str(data);
    paths.ptr_ = (char *)SVar1.length_;
    local_48 = 0;
    local_50 = (undefined8 *)operator_new(0x10);
    *local_50 = RenderOneFieldPath;
    local_50[1] = ow;
    local_38 = std::
               _Function_handler<google::protobuf::util::Status_(google::protobuf::StringPiece),_std::_Bind<google::protobuf::util::Status_(*(google::protobuf::util::converter::ProtoStreamObjectWriter_*,_std::_Placeholder<1>))(google::protobuf::util::converter::ProtoStreamObjectWriter_*,_google::protobuf::StringPiece)>_>
               ::_M_invoke;
    local_40 = std::
               _Function_handler<google::protobuf::util::Status_(google::protobuf::StringPiece),_std::_Bind<google::protobuf::util::Status_(*(google::protobuf::util::converter::ProtoStreamObjectWriter_*,_std::_Placeholder<1>))(google::protobuf::util::converter::ProtoStreamObjectWriter_*,_google::protobuf::StringPiece)>_>
               ::_M_manager;
    paths.length_ = (stringpiece_ssize_type)&local_50;
    DecodeCompactFieldMaskPaths(__return_storage_ptr__,(converter *)SVar1.ptr_,paths,in_R8);
    if (local_40 != (code *)0x0) {
      (*local_40)(&local_50,&local_50,3);
    }
  }
  else if (data->type_ == TYPE_NULL) {
    Status::Status(__return_storage_ptr__);
  }
  else {
    local_f0 = "Invalid data type for field mask, value is ";
    local_e8 = 0x2b;
    b = (AlphaNum *)0x0;
    DataPiece::ValueAsStringOrDefault_abi_cxx11_(&local_90,data,(StringPiece)ZEXT816(0x346c7c));
    local_c0.piece_data_ = local_90._M_dataplus._M_p;
    local_c0.piece_size_ = local_90._M_string_length;
    StrCat_abi_cxx11_(&local_70,(protobuf *)&local_f0,&local_c0,b);
    SVar1.length_ = local_70._M_string_length;
    SVar1.ptr_ = local_70._M_dataplus._M_p;
    if ((long)local_70._M_string_length < 0) {
      StringPiece::LogFatalSizeTooBig(local_70._M_string_length,"size_t to int conversion");
    }
    Status::Status(__return_storage_ptr__,INVALID_ARGUMENT,SVar1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Status ProtoStreamObjectWriter::RenderFieldMask(ProtoStreamObjectWriter* ow,
                                                const DataPiece& data) {
  if (data.type() == DataPiece::TYPE_NULL) return Status();
  if (data.type() != DataPiece::TYPE_STRING) {
    return Status(util::error::INVALID_ARGUMENT,
                  StrCat("Invalid data type for field mask, value is ",
                               data.ValueAsStringOrDefault("")));
  }

  // TODO(tsun): figure out how to do proto descriptor based snake case
  // conversions as much as possible. Because ToSnakeCase sometimes returns the
  // wrong value.
  return DecodeCompactFieldMaskPaths(data.str(),
                                     std::bind(&RenderOneFieldPath, ow, _1));
}